

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

Vec3f __thiscall Raytracer::Camera::WorldToCamera(Camera *this,Vec3f *pos,Image *image)

{
  RGB **ppRVar1;
  undefined8 uVar2;
  long in_RCX;
  double dVar3;
  undefined8 extraout_XMM0_Qa;
  int iVar4;
  float fVar5;
  Vec3f VVar6;
  
  ppRVar1 = image->datas;
  uVar2 = *(undefined8 *)(in_RCX + 8);
  iVar4 = (int)uVar2;
  fVar5 = SUB84(ppRVar1,0) - (float)(iVar4 / 2);
  dVar3 = tan((double)(pos[1].x * 0.5));
  (this->origin).x = fVar5;
  (this->origin).y = (float)((ulong)ppRVar1 >> 0x20) - (float)((int)((ulong)uVar2 >> 0x20) / 2);
  (this->origin).z = (float)((double)-iVar4 / (dVar3 + dVar3));
  Vec3<float>::normalize(&this->origin);
  VVar6.z = fVar5;
  VVar6.x = (float)(int)extraout_XMM0_Qa;
  VVar6.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar6;
}

Assistant:

Vec3f Raytracer::Camera::WorldToCamera(const Vec3f &pos ,const Raytracer::Image& image) const{

    float x = pos.x-(image.width/2);
    float y  = pos.y-(image.height/2);
    float z = -image.width / (2 * tan(fov /2));
    Vec3f direction(x, y, z);
    direction.normalize();
    return direction;

}